

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitAndAssign(wasm::Expression*,wasm::IString_
          (void *this,Expression *curr,IString result)

{
  IString nextResult;
  bool bVar1;
  Ref RVar2;
  Ref this_00;
  char *extraout_RDX;
  Ref in_R8;
  IString op;
  IString name;
  Ref ret;
  Expression *curr_local;
  ExpressionProcessor *this_local;
  IString result_local;
  
  result_local.str._M_len = (size_t)result.str._M_str;
  this_local = (ExpressionProcessor *)result.str._M_len;
  bVar1 = IString::operator!=((IString *)&this_local,(IString *)&NO_RESULT);
  if (!bVar1) {
    __assert_fail("result != NO_RESULT",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                  ,0x461,
                  "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitAndAssign(Expression *, IString)"
                 );
  }
  nextResult.str._M_str = (char *)result_local.str._M_len;
  nextResult.str._M_len = (size_t)this_local;
  RVar2 = visit(wasm::Expression*,wasm::IString_(this,curr,nextResult);
  name.str._M_str = extraout_RDX;
  name.str._M_len = result_local.str._M_len;
  this_00 = cashew::ValueBuilder::makeName((ValueBuilder *)this_local,name);
  op.str._M_str = (char *)RVar2.inst;
  op.str._M_len = BLOCK;
  RVar2 = cashew::ValueBuilder::makeBinary(this_00.inst,cashew::SET,op,in_R8);
  RVar2 = cashew::ValueBuilder::makeStatement(RVar2);
  return (Ref)RVar2.inst;
}

Assistant:

Ref visitAndAssign(Expression* curr, IString result) {
      assert(result != NO_RESULT);
      Ref ret = visit(curr, result);
      return ValueBuilder::makeStatement(
        ValueBuilder::makeBinary(ValueBuilder::makeName(result), SET, ret));
    }